

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O1

DdNode * Cudd_addAgreement(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  pDVar3 = *f;
  pDVar1 = *g;
  if ((pDVar3 != pDVar1) && (pDVar2 = dd->background, pDVar3 != pDVar2)) {
    if (pDVar1 == pDVar2) {
      return pDVar1;
    }
    if ((pDVar3->index != 0x7fffffff) || (pDVar3 = pDVar2, pDVar1->index != 0x7fffffff)) {
      return (DdNode *)0x0;
    }
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_addAgreement(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == G) return(F);
    if (F == dd->background) return(F);
    if (G == dd->background) return(G);
    if (cuddIsConstant(F) && cuddIsConstant(G)) return(dd->background);
    return(NULL);

}